

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::ClassPropertyDeclarationSyntax::getChild
          (ClassPropertyDeclarationSyntax *this,size_t index)

{
  long in_RDX;
  long in_RSI;
  TokenOrSyntax *in_RDI;
  SyntaxNode *in_stack_ffffffffffffffa8;
  TokenOrSyntax *in_stack_ffffffffffffffb0;
  nullptr_t in_stack_ffffffffffffffb8;
  TokenOrSyntax *in_stack_ffffffffffffffc0;
  
  if (in_RDX == 0) {
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  else if (in_RDX == 1) {
    TokenOrSyntax::TokenOrSyntax((TokenOrSyntax *)(in_RSI + 0x50),in_stack_ffffffffffffffa8);
  }
  else if (in_RDX == 2) {
    not_null<slang::syntax::MemberSyntax_*>::get
              ((not_null<slang::syntax::MemberSyntax_*> *)(in_RSI + 0x88));
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  else {
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  return in_RDI;
}

Assistant:

TokenOrSyntax ClassPropertyDeclarationSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return &attributes;
        case 1: return &qualifiers;
        case 2: return declaration.get();
        default: return nullptr;
    }
}